

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O0

bool __thiscall QHttp2Connection::sendGOAWAY(QHttp2Connection *this,Http2Error errorCode)

{
  long lVar1;
  QIODevice *pQVar2;
  ssize_t sVar3;
  size_t __n;
  void *__buf;
  undefined4 in_ESI;
  QFlags<Http2::FrameFlag> *in_RDI;
  long in_FS_OFFSET;
  uint uVar4;
  FrameWriter *this_00;
  undefined4 in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (FrameWriter *)(in_RDI + 0x94);
  uVar4 = 0;
  QFlags<Http2::FrameFlag>::QFlags(in_RDI,EMPTY);
  __n = (size_t)uVar4;
  Http2::FrameWriter::start
            ((FrameWriter *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),
             (FrameType)((ulong)this_00 >> 0x38),
             (QFlagsStorageHelper<Http2::FrameFlag,_4>)SUB84((ulong)in_RDI >> 0x20,0),
             (quint32)this_00);
  Http2::FrameWriter::append<unsigned_int>
            ((FrameWriter *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),
             (uint)((ulong)this_00 >> 0x20));
  Http2::FrameWriter::append<unsigned_int>
            ((FrameWriter *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),
             (uint)((ulong)this_00 >> 0x20));
  pQVar2 = getSocket((QHttp2Connection *)0x2b9778);
  sVar3 = Http2::FrameWriter::write(this_00,(int)pQVar2,__buf,__n);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)((byte)sVar3 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QHttp2Connection::sendGOAWAY(Http2::Http2Error errorCode)
{
    frameWriter.start(FrameType::GOAWAY, FrameFlag::EMPTY,
                      Http2PredefinedParameters::connectionStreamID);
    frameWriter.append(quint32(m_lastIncomingStreamID));
    frameWriter.append(quint32(errorCode));
    return frameWriter.write(*getSocket());
}